

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-memory.c
# Opt level: O1

void bson_mem_set_vtable(bson_mem_vtable_t *vtable)

{
  bson_mem_vtable_t bStack_50;
  code *pcStack_10;
  
  if (vtable != (bson_mem_vtable_t *)0x0) {
    if ((((vtable->malloc == (_func_void_ptr_size_t *)0x0) ||
         (vtable->calloc == (_func_void_ptr_size_t_size_t *)0x0)) ||
        (vtable->realloc == (_func_void_ptr_void_ptr_size_t *)0x0)) ||
       (vtable->free == (_func_void_void_ptr *)0x0)) {
      pcStack_10 = (code *)0x116851;
      bson_mem_set_vtable_cold_1();
    }
    else {
      gMemVtable.malloc = vtable->malloc;
      gMemVtable.calloc = vtable->calloc;
      gMemVtable.realloc = vtable->realloc;
      gMemVtable.free = vtable->free;
      gMemVtable.padding[0] = vtable->padding[0];
      gMemVtable.padding[1] = vtable->padding[1];
      gMemVtable.padding[2] = vtable->padding[2];
      gMemVtable.padding[3] = vtable->padding[3];
    }
    return;
  }
  pcStack_10 = bson_mem_restore_vtable;
  bson_mem_set_vtable_cold_2();
  bStack_50.padding[2] = (void *)0x0;
  bStack_50.padding[3] = (void *)0x0;
  bStack_50.padding[0] = (void *)0x0;
  bStack_50.padding[1] = (void *)0x0;
  bStack_50.realloc = realloc;
  bStack_50.free = free;
  bStack_50.malloc = malloc;
  bStack_50.calloc = calloc;
  bson_mem_set_vtable(&bStack_50);
  return;
}

Assistant:

void
bson_mem_set_vtable (const bson_mem_vtable_t *vtable)
{
   BSON_ASSERT (vtable);

   if (!vtable->malloc || !vtable->calloc || !vtable->realloc ||
       !vtable->free) {
      fprintf (stderr,
               "Failure to install BSON vtable, "
               "missing functions.\n");
      return;
   }

   gMemVtable = *vtable;
}